

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O2

void __thiscall chrono::ChArchiveOutJSON::out(ChArchiveOutJSON *this,ChNameValue<double> *bVal)

{
  _Elt_pointer pbVar1;
  ChStreamOutAscii *pCVar2;
  _Elt_pointer piVar3;
  
  comma_cr(this);
  indent(this);
  pbVar1 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 == (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pbVar1 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
  }
  if (pbVar1[-1] == false) {
    pCVar2 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,bVal->_name);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar2,"\t: ");
  }
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),*bVal->_value);
  piVar3 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  piVar3[-1] = piVar3[-1] + 1;
  return;
}

Assistant:

virtual void out     (ChNameValue<double> bVal) {
            comma_cr();
            indent();
            if (is_array.top()==false)
                (*ostream) << "\"" << bVal.name() << "\"" << "\t: ";
            (*ostream) << bVal.value();
            ++nitems.top();
      }